

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O2

void spvtools::opt::anon_unknown_0::ReplaceLoadWithCompositeConstruct
               (IRContext *context,
               unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
               *loads_to_composites)

{
  _Hash_node_base def;
  _Hash_node_base *p_Var1;
  Instruction *inst;
  pointer ppIVar2;
  DefUseManager *pDVar3;
  __node_base *p_Var4;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range3;
  pointer ppIVar5;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> users;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  p_Var4 = &(loads_to_composites->_M_h)._M_before_begin;
  while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
    def._M_nxt = p_Var4[1]._M_nxt;
    p_Var1 = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var4 + 2))->_M_max_load_factor;
    users.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    users.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    users.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pDVar3 = IRContext::get_def_use_mgr(context);
    local_38 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/interface_var_sroa.cpp:119:15)>
               ::_M_invoke;
    local_40 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/interface_var_sroa.cpp:119:15)>
               ::_M_manager;
    local_50._M_unused._M_object = &users;
    local_50._8_8_ = p_Var1;
    analysis::DefUseManager::ForEachUse
              (pDVar3,(Instruction *)def._M_nxt,
               (function<void_(spvtools::opt::Instruction_*,_unsigned_int)> *)&local_50);
    ppIVar5 = users.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppIVar2 = users.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
      ppIVar5 = users.
                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppIVar2 = users.
                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    for (; ppIVar5 != ppIVar2; ppIVar5 = ppIVar5 + 1) {
      inst = *ppIVar5;
      pDVar3 = IRContext::get_def_use_mgr(context);
      analysis::DefUseManager::AnalyzeInstUse(pDVar3,inst);
    }
    std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
    ~_Vector_base(&users.
                   super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 );
  }
  return;
}

Assistant:

void ReplaceLoadWithCompositeConstruct(
    IRContext* context,
    const std::unordered_map<Instruction*, Instruction*>& loads_to_composites) {
  for (const auto& load_and_composite : loads_to_composites) {
    Instruction* load = load_and_composite.first;
    Instruction* composite_construct = load_and_composite.second;

    std::vector<Instruction*> users;
    context->get_def_use_mgr()->ForEachUse(
        load, [&users, composite_construct](Instruction* user, uint32_t index) {
          user->GetOperand(index).words[0] = composite_construct->result_id();
          users.push_back(user);
        });

    for (Instruction* user : users)
      context->get_def_use_mgr()->AnalyzeInstUse(user);
  }
}